

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O0

TaylorExtrapolator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *
ChebTools::make_Taylor_extrapolator
          (TaylorExtrapolator<Eigen::Array<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          ChebyshevExpansion *ce,double x,int degree)

{
  Scalar *pSVar1;
  double dVar2;
  ChebyshevExpansion local_80;
  int local_40;
  int local_3c;
  int n;
  ArrayXd c;
  int degree_local;
  double x_local;
  ChebyshevExpansion *ce_local;
  
  local_3c = degree + 1;
  c.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = degree;
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::Array<int>((Array<double,__1,_1,_0,__1,_1> *)&n,&local_3c);
  for (local_40 = 0;
      local_40 <=
      c.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_;
      local_40 = local_40 + 1) {
    ChebyshevExpansion::deriv(&local_80,ce,(long)local_40);
    dVar2 = ChebyshevExpansion::y(&local_80,x);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&n,
                        (long)local_40);
    *pSVar1 = dVar2;
    ChebyshevExpansion::~ChebyshevExpansion(&local_80);
  }
  TaylorExtrapolator<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::TaylorExtrapolator
            (__return_storage_ptr__,(Array<double,__1,_1,_0,__1,_1> *)&n,x);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)&n);
  return __return_storage_ptr__;
}

Assistant:

static auto make_Taylor_extrapolator(const ChebyshevExpansion &ce, double x, int degree) {
        Eigen::ArrayXd c(degree + 1);
        for (auto n = 0; n <= degree; ++n) {
            c[n] = ce.deriv(n).y(x);
        }
        return TaylorExtrapolator<decltype(c)>(c, x);
    }